

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
* __thiscall
cmGlobalNinjaGenerator::GenerateBuildCommand
          (vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *makeProgram,string *param_2,
          string *param_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targetNames,string *param_5,bool param_6,int jobs,bool verbose,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  initializer_list<cmGlobalGenerator::GeneratedMakeCommand> __l;
  bool bVar1;
  const_iterator start;
  const_iterator end;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  allocator<cmGlobalGenerator::GeneratedMakeCommand> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  size_type local_110;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tname;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_d8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  undefined1 local_60 [8];
  GeneratedMakeCommand makeCommand;
  bool verbose_local;
  bool param_6_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targetNames_local;
  string *param_3_local;
  string *param_2_local;
  string *makeProgram_local;
  cmGlobalNinjaGenerator *this_local;
  
  makeCommand.super_GeneratedMakeCommand._31_1_ = param_6;
  makeCommand.super_GeneratedMakeCommand._30_1_ = verbose;
  cmGlobalGenerator::GeneratedMakeCommand::GeneratedMakeCommand((GeneratedMakeCommand *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  cmGlobalGenerator::SelectMakeProgram(&local_80,(cmGlobalGenerator *)this,makeProgram,&local_a0);
  detail::GeneratedMakeCommand::Add<std::__cxx11::string>
            ((GeneratedMakeCommand *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  if ((makeCommand.super_GeneratedMakeCommand._30_1_ & 1) != 0) {
    detail::GeneratedMakeCommand::Add<char_const(&)[3]>
              ((GeneratedMakeCommand *)local_60,(char (*) [3])"-v");
  }
  if ((jobs != -1) && (jobs != 0)) {
    std::__cxx11::to_string(&local_d8,jobs);
    detail::GeneratedMakeCommand::Add<char_const(&)[3],std::__cxx11::string>
              ((GeneratedMakeCommand *)local_60,(char (*) [3])"-j",&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  start = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(makeOptions);
  end = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(makeOptions);
  detail::GeneratedMakeCommand::Add((GeneratedMakeCommand *)local_60,start,end);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(targetNames);
  tname = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(targetNames);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&tname);
    if (!bVar1) break;
    local_108 = (undefined1  [8])
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      detail::GeneratedMakeCommand::Add<std::__cxx11::string_const&>
                ((GeneratedMakeCommand *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmGlobalGenerator::GeneratedMakeCommand::GeneratedMakeCommand
            ((GeneratedMakeCommand *)&local_138,(GeneratedMakeCommand *)local_60);
  local_110 = 1;
  local_118 = &local_138;
  std::allocator<cmGlobalGenerator::GeneratedMakeCommand>::allocator(&local_139);
  __l._M_len = local_110;
  __l._M_array = (iterator)local_118;
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::vector(__return_storage_ptr__,__l,&local_139);
  std::allocator<cmGlobalGenerator::GeneratedMakeCommand>::~allocator(&local_139);
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118;
  do {
    local_198 = local_198 + -1;
    cmGlobalGenerator::GeneratedMakeCommand::~GeneratedMakeCommand
              ((GeneratedMakeCommand *)local_198);
  } while (local_198 != &local_138);
  cmGlobalGenerator::GeneratedMakeCommand::~GeneratedMakeCommand((GeneratedMakeCommand *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGlobalGenerator::GeneratedMakeCommand>
cmGlobalNinjaGenerator::GenerateBuildCommand(
  const std::string& makeProgram, const std::string& /*projectName*/,
  const std::string& /*projectDir*/,
  std::vector<std::string> const& targetNames, const std::string& /*config*/,
  bool /*fast*/, int jobs, bool verbose,
  std::vector<std::string> const& makeOptions)
{
  GeneratedMakeCommand makeCommand;
  makeCommand.Add(this->SelectMakeProgram(makeProgram));

  if (verbose) {
    makeCommand.Add("-v");
  }

  if ((jobs != cmake::NO_BUILD_PARALLEL_LEVEL) &&
      (jobs != cmake::DEFAULT_BUILD_PARALLEL_LEVEL)) {
    makeCommand.Add("-j", std::to_string(jobs));
  }

  makeCommand.Add(makeOptions.begin(), makeOptions.end());
  for (const auto& tname : targetNames) {
    if (!tname.empty()) {
      makeCommand.Add(tname);
    }
  }
  return { std::move(makeCommand) };
}